

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::Parser::LocationRecorder::RecordLegacyImportLocation
          (LocationRecorder *this,Message *descriptor,string *name)

{
  int line;
  SourceLocationTable *this_00;
  Location *pLVar1;
  LogMessage *pLVar2;
  int *piVar3;
  LogFinisher local_a9;
  Message *local_a8;
  LogMessage local_a0;
  LogMessage local_68;
  
  this_00 = this->parser_->source_location_table_;
  if (this_00 != (SourceLocationTable *)0x0) {
    pLVar1 = this->location_;
    if ((pLVar1->span_).current_size_ < 1) {
      internal::LogMessage::LogMessage
                (&local_a0,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
                 ,0x280);
      pLVar2 = internal::LogMessage::operator<<
                         (&local_a0,"CHECK failed: (index) < (current_size_): ");
      internal::LogFinisher::operator=((LogFinisher *)&local_68,pLVar2);
      internal::LogMessage::~LogMessage(&local_a0);
    }
    local_a8 = descriptor;
    piVar3 = RepeatedField<int>::elements(&pLVar1->span_);
    line = *piVar3;
    pLVar1 = this->location_;
    if ((pLVar1->span_).current_size_ < 2) {
      internal::LogMessage::LogMessage
                (&local_68,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
                 ,0x280);
      pLVar2 = internal::LogMessage::operator<<
                         (&local_68,"CHECK failed: (index) < (current_size_): ");
      internal::LogFinisher::operator=(&local_a9,pLVar2);
      internal::LogMessage::~LogMessage(&local_68);
    }
    piVar3 = RepeatedField<int>::elements(&pLVar1->span_);
    SourceLocationTable::AddImport(this_00,local_a8,name,line,piVar3[1]);
  }
  return;
}

Assistant:

void Parser::LocationRecorder::RecordLegacyImportLocation(
    const Message* descriptor, const std::string& name) {
  if (parser_->source_location_table_ != nullptr) {
    parser_->source_location_table_->AddImport(
        descriptor, name, location_->span(0), location_->span(1));
  }
}